

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_ErrorCode ZVar7;
  ulong uVar8;
  size_t sVar9;
  XXH64_hash_t XVar10;
  byte *src_00;
  uint *puVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  ushort uVar15;
  ulong srcSize_00;
  void *pvVar16;
  uint *puVar17;
  ulong local_88;
  
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  pvVar13 = dst;
  if (4 < srcSize) {
    bVar4 = 0;
    sVar14 = srcSize;
    do {
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        if (sVar14 < 8) {
          return 0xffffffffffffffb8;
        }
        uVar8 = (ulong)*(uint *)((long)src + 4) + 8;
        srcSize = sVar14 - uVar8;
        if (sVar14 < uVar8) {
          return 0xffffffffffffffb8;
        }
        puVar17 = (uint *)((long)src + uVar8);
      }
      else {
        if (ddict == (ZSTD_DDict *)0x0) {
          sVar9 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
          if (0xffffffffffffff88 < sVar9) {
            return sVar9;
          }
        }
        else {
          ZSTD_decompressBegin_usingDDict(dctx,ddict);
        }
        pvVar16 = dctx->previousDstEnd;
        if (pvVar16 != pvVar13) {
          dctx->dictEnd = pvVar16;
          dctx->vBase = (void *)(((long)dctx->base - (long)pvVar16) + (long)pvVar13);
          dctx->base = pvVar13;
          dctx->previousDstEnd = pvVar13;
        }
        srcSize = sVar14;
        puVar17 = (uint *)src;
        if (sVar14 < 9) {
LAB_00159ad5:
          sVar9 = 0xffffffffffffffb8;
        }
        else {
          bVar2 = (byte)*(uint *)((long)src + 4);
          lVar1 = ZSTD_did_fieldSize[bVar2 & 3] +
                  *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar2 >> 3 & 0x18)) +
                  (ulong)((bVar2 & 0x20) == 0) + (ulong)(bVar2 < 0x40 & (byte)((bVar2 & 0x20) >> 5))
          ;
          sVar12 = lVar1 + 5;
          sVar9 = sVar12;
          if (sVar12 < 0xffffffffffffff89) {
            if (sVar14 < lVar1 + 8U) goto LAB_00159ad5;
            sVar9 = ZSTD_decodeFrameHeader(dctx,src,sVar12);
            if (sVar9 < 0xffffffffffffff89) {
              puVar11 = (uint *)((long)src + sVar12);
              local_88 = sVar14 - sVar12;
              pvVar16 = pvVar13;
              do {
                if (local_88 < 3) goto LAB_00159ad5;
                uVar5 = *puVar11;
                uVar6 = (uint)(uint3)((uint3)*puVar11 >> 3);
                uVar15 = (ushort)uVar5 >> 1 & 3;
                if (uVar15 == 1) {
                  uVar3 = 1;
                }
                else {
                  sVar9 = 0xffffffffffffffec;
                  uVar3 = uVar6;
                  if (uVar15 == 3) goto LAB_00159cb6;
                }
                srcSize_00 = (ulong)uVar3;
                uVar8 = local_88 - 3;
                local_88 = uVar8 - srcSize_00;
                if (uVar8 < srcSize_00) goto LAB_00159ad5;
                src_00 = (byte *)((long)puVar11 + 3);
                sVar12 = (long)pvVar13 + (dstCapacity - (long)pvVar16);
                if (uVar15 == 2) {
                  sVar9 = ZSTD_decompressBlock_internal(dctx,pvVar16,sVar12,src_00,srcSize_00,1);
                  if (0xffffffffffffff88 < sVar9) goto LAB_00159cb6;
                }
                else if (uVar15 == 1) {
                  sVar9 = (size_t)uVar6;
                  if (sVar12 < sVar9) {
LAB_00159d0a:
                    sVar9 = 0xffffffffffffffba;
                    goto LAB_00159cb6;
                  }
                  memset(pvVar16,(uint)*src_00,sVar9);
                }
                else {
                  if (sVar12 < srcSize_00) goto LAB_00159d0a;
                  memcpy(pvVar16,src_00,srcSize_00);
                  sVar9 = srcSize_00;
                }
                if ((dctx->fParams).checksumFlag != 0) {
                  XXH64_update(&dctx->xxhState,pvVar16,sVar9);
                }
                pvVar16 = (void *)((long)pvVar16 + sVar9);
                puVar11 = (uint *)(src_00 + srcSize_00);
              } while (((ushort)uVar5 & 1) == 0);
              sVar9 = (dctx->fParams).frameContentSize;
              sVar12 = (long)pvVar16 - (long)pvVar13;
              if ((sVar9 == 0xffffffffffffffff) || (sVar12 == sVar9)) {
                sVar9 = sVar12;
                srcSize = local_88;
                puVar17 = puVar11;
                if ((dctx->fParams).checksumFlag != 0) {
                  XVar10 = XXH64_digest(&dctx->xxhState);
                  sVar9 = 0xffffffffffffffea;
                  srcSize = sVar14;
                  puVar17 = (uint *)src;
                  if ((3 < local_88) && (*puVar11 == (uint)XVar10)) {
                    sVar9 = sVar12;
                    srcSize = local_88 - 4;
                    puVar17 = puVar11 + 1;
                  }
                }
              }
              else {
                sVar9 = 0xffffffffffffffec;
              }
            }
          }
        }
LAB_00159cb6:
        ZVar7 = ZSTD_getErrorCode(sVar9);
        if ((bool)(bVar4 & ZVar7 == ZSTD_error_prefix_unknown)) {
          return 0xffffffffffffffb8;
        }
        if (0xffffffffffffff88 < sVar9) {
          return sVar9;
        }
        pvVar13 = (void *)((long)pvVar13 + sVar9);
        dstCapacity = dstCapacity - sVar9;
        bVar4 = 1;
      }
      sVar14 = srcSize;
      src = puVar17;
    } while (4 < srcSize);
  }
  sVar14 = 0xffffffffffffffb8;
  if (srcSize == 0) {
    sVar14 = (long)pvVar13 - (long)dst;
  }
  return sVar14;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDictDictContent(ddict);
        dictSize = ZSTD_DDictDictSize(ddict);
    }

    while (srcSize >= ZSTD_frameHeaderSize_prefix) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            /* legacy support is not compatible with static dctx */
            if (dctx->staticSize) return ERROR(memory_allocation);

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);

            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (U32)magicNumber, (U32)ZSTD_MAGICNUMBER);
            if ((magicNumber & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t skippableSize;
                if (srcSize < ZSTD_skippableHeaderSize)
                    return ERROR(srcSize_wrong);
                skippableSize = MEM_readLE32((const BYTE*)src + ZSTD_frameIdSize)
                              + ZSTD_skippableHeaderSize;
                if (srcSize < skippableSize) return ERROR(srcSize_wrong);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            CHECK_F(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            CHECK_F(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            if ( (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
              && (moreThan1Frame==1) ) {
                /* at least one frame successfully completed,
                 * but following bytes are garbage :
                 * it's more likely to be a srcSize error,
                 * specifying more bytes than compressed size of frame(s).
                 * This error message replaces ERROR(prefix_unknown),
                 * which would be confusing, as the first header is actually correct.
                 * Note that one could be unlucky, it might be a corruption error instead,
                 * happening right at the place where we expect zstd magic bytes.
                 * But this is _much_ less likely than a srcSize field error. */
                return ERROR(srcSize_wrong);
            }
            if (ZSTD_isError(res)) return res;
            /* no need to bound check, ZSTD_decompressFrame already has */
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ERROR(srcSize_wrong); /* input not entirely consumed */

    return (BYTE*)dst - (BYTE*)dststart;
}